

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_fetch_flow_entry(yaml_parser_t *parser)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  yaml_token_t *__dest;
  int iVar6;
  int local_a4;
  int local_a0;
  int local_9c;
  undefined4 local_98 [2];
  yaml_token_t token;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  yaml_parser_t *parser_local;
  
  iVar6 = yaml_parser_remove_simple_key(parser);
  if (iVar6 == 0) {
    parser_local._4_4_ = 0;
  }
  else {
    parser->simple_key_allowed = 1;
    sVar1 = (parser->mark).index;
    sVar2 = (parser->mark).line;
    sVar3 = (parser->mark).column;
    (parser->mark).index = (parser->mark).index + 1;
    (parser->mark).column = (parser->mark).column + 1;
    parser->unread = parser->unread - 1;
    if ((*(parser->buffer).pointer & 0x80) == 0) {
      local_9c = 1;
    }
    else {
      if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
        local_a0 = 2;
      }
      else {
        if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
          local_a4 = 3;
        }
        else {
          local_a4 = 0;
          if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
            local_a4 = 4;
          }
        }
        local_a0 = local_a4;
      }
      local_9c = local_a0;
    }
    (parser->buffer).pointer = (parser->buffer).pointer + local_9c;
    token.end_mark.column = (parser->mark).index;
    sVar4 = (parser->mark).line;
    sVar5 = (parser->mark).column;
    memset(local_98,0,0x50);
    local_98[0] = 0xf;
    token.start_mark.column = token.end_mark.column;
    token.data._16_8_ = sVar1;
    token.start_mark.index = sVar2;
    token.start_mark.line = sVar3;
    token.end_mark.index = sVar4;
    token.end_mark.line = sVar5;
    if (((parser->tokens).tail == (parser->tokens).end) &&
       (iVar6 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,
                                  &(parser->tokens).tail,&(parser->tokens).end), iVar6 == 0)) {
      parser->error = YAML_MEMORY_ERROR;
      parser_local._4_4_ = 0;
    }
    else {
      __dest = (parser->tokens).tail;
      (parser->tokens).tail = __dest + 1;
      memcpy(__dest,local_98,0x50);
      parser_local._4_4_ = 1;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_fetch_flow_entry(yaml_parser_t *parser)
{
    yaml_mark_t start_mark, end_mark;
    yaml_token_t token;

    /* Reset any potential simple keys on the current flow level. */

    if (!yaml_parser_remove_simple_key(parser))
        return 0;

    /* Simple keys are allowed after ','. */

    parser->simple_key_allowed = 1;

    /* Consume the token. */

    start_mark = parser->mark;
    SKIP(parser);
    end_mark = parser->mark;

    /* Create the FLOW-ENTRY token and append it to the queue. */

    TOKEN_INIT(token, YAML_FLOW_ENTRY_TOKEN, start_mark, end_mark);

    if (!ENQUEUE(parser, parser->tokens, token))
        return 0;

    return 1;
}